

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

SUNErrCode SUNQRAdd_ICWY_SB(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint uVar1;
  sunrealtype *c;
  long lVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  sunrealtype __x;
  double dVar11;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    uVar1 = m - 1;
    iVar3 = uVar1 * mMax;
    lVar2 = (long)iVar3 * 8;
    N_VDotProdMultiLocal(m,Q[uVar1],Q,(sunrealtype *)(*(long *)((long)QRdata + 0x10) + lVar2));
    uVar10 = (ulong)(uint)m;
    N_VDotProdMultiLocal
              (m,*QRdata,Q,(sunrealtype *)(*(long *)((long)QRdata + 0x10) + lVar2 + uVar10 * 8));
    N_VDotProdMultiAllReduce(m * 2,*QRdata,(sunrealtype *)(lVar2 + *(long *)((long)QRdata + 0x10)));
    lVar2 = *(long *)((long)QRdata + 0x10);
    c = R + mMax * m;
    uVar4 = 0;
    do {
      c[uVar4] = *(sunrealtype *)((long)(iVar3 + m) * 8 + lVar2 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar10 != uVar4);
    lVar2 = *(long *)((long)QRdata + 0x10);
    *(undefined8 *)(lVar2 + (long)(int)(iVar3 + uVar1) * 8) = 0x3ff0000000000000;
    lVar6 = (long)mMax;
    pdVar5 = (double *)(lVar2 + lVar6 * 8);
    uVar4 = 0;
    do {
      uVar7 = uVar4 + 1;
      pdVar8 = pdVar5;
      for (uVar9 = uVar7; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        c[uVar9] = c[uVar9] - c[uVar4] * *pdVar8;
        pdVar8 = pdVar8 + lVar6;
      }
      pdVar5 = pdVar5 + lVar6 + 1;
      uVar4 = uVar7;
    } while (uVar7 != uVar10);
    N_VLinearCombination(m,c,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  __x = N_VDotProd(*QRdata,*QRdata);
  iVar3 = (mMax + 1) * m;
  R[iVar3] = __x;
  dVar11 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar11 = sqrt(__x);
    }
    else {
      dVar11 = SQRT(__x);
    }
  }
  R[iVar3] = dVar11;
  N_VScale(1.0 / dVar11,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_ICWY_SB(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                            int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j, k;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* stores d_fi in temp */

  if (m > 0)
  {
    /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
    SUNCheckCall(N_VDotProdMultiLocal(m, Q[m - 1], Q,
                                      qrdata->temp_array + (m - 1) * mMax));

    /* R(1:k-1,k) = Q_k-1^T * df */
    /* Put R values at end of temp_array */
    SUNCheckCall(N_VDotProdMultiLocal(m, qrdata->vtemp, Q,
                                      qrdata->temp_array + (m - 1) * mMax + m));

    SUNCheckCall(N_VDotProdMultiAllReduce(m + m, qrdata->vtemp,
                                          qrdata->temp_array + (m - 1) * mMax));

    /* Move the last values from temp array into R */
    for (k = 0; k < m; k++)
    {
      R[m * mMax + k] = qrdata->temp_array[(m - 1) * mMax + m + k];
    }

    /* T(k-1,k-1) = 1.0 */
    qrdata->temp_array[(m - 1) * mMax + (m - 1)] = ONE;

    /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
    for (k = 0; k < m; k++)
    {
      /* Skip setting the diagonal element because it doesn't change */
      for (j = k + 1; j < m; j++)
      {
        R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
      }
    }
    /* end */

    /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / \| df \| */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}